

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O2

void __thiscall QLatin1StringMatcher::setSearcher(QLatin1StringMatcher *this)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (this->m_cs != CaseSensitive) {
    lVar5 = (this->m_pattern).m_size;
    lVar4 = 0x100;
    if (lVar5 < 0x100) {
      lVar4 = lVar5;
    }
    pcVar2 = (this->m_pattern).m_data;
    pcVar1 = this->m_foldBuffer;
    lVar3 = 0;
    lVar5 = 0;
    if (0 < lVar4) {
      lVar5 = lVar4;
    }
    for (; lVar5 != lVar3; lVar3 = lVar3 + 1) {
      pcVar1[lVar3] = ""[(byte)pcVar2[lVar3]];
    }
    QtPrivate::
    q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
    ::q_boyer_moore_searcher_hashed_needle
              ((q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
                *)&(this->field_2).m_caseSensitiveSearcher,pcVar1,pcVar1 + lVar4);
    return;
  }
  pcVar1 = (this->m_pattern).m_data;
  QtPrivate::
  q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
  ::q_boyer_moore_searcher_hashed_needle
            (&(this->field_2).m_caseSensitiveSearcher,pcVar1,pcVar1 + (this->m_pattern).m_size);
  return;
}

Assistant:

void QLatin1StringMatcher::setSearcher() noexcept
{
    if (m_cs == Qt::CaseSensitive) {
        new (&m_caseSensitiveSearcher) CaseSensitiveSearcher(m_pattern.data(), m_pattern.end());
    } else {
        QtPrivate::QCaseInsensitiveLatin1Hash foldCase;
        qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        for (qsizetype i = 0; i < bufferSize; ++i)
            m_foldBuffer[i] = static_cast<char>(foldCase(m_pattern[i].toLatin1()));

        new (&m_caseInsensitiveSearcher)
                CaseInsensitiveSearcher(m_foldBuffer, &m_foldBuffer[bufferSize]);
    }
}